

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytable.hpp
# Opt level: O2

int to_func_keys_index(uint keycode)

{
  int iVar1;
  
  if (keycode == 1) {
    return 0;
  }
  if ((keycode & 0xfffffffe) == 0x1c) {
    iVar1 = keycode - 0x19;
  }
  else if ((keycode & 0xfffffffe) == 0xe) {
    iVar1 = keycode - 0xd;
  }
  else {
    if (keycode == 0x2a) {
      return 5;
    }
    if (keycode - 0x36 < 0x1e) {
      iVar1 = keycode - 0x30;
    }
    else if (keycode - 0x57 < 2) {
      iVar1 = keycode - 0x33;
    }
    else {
      if ((keycode & 0xfffffff0) != 0x60) {
        if (keycode == 0x77) {
          return 0x36;
        }
        iVar1 = -1;
        if (keycode - 0x7d < 3) {
          iVar1 = keycode - 0x46;
        }
        return iVar1;
      }
      iVar1 = keycode - 0x3a;
    }
  }
  return iVar1;
}

Assistant:

inline int to_func_keys_index(unsigned int keycode)
{
  if (keycode == KEY_ESC)               // 1
    return 0;
  if (keycode >= KEY_BACKSPACE && keycode <= KEY_TAB)               // 14-15
    return keycode - 13;
  if (keycode >= KEY_ENTER && keycode <= KEY_LEFTCTRL)               // 28-29
    return keycode - 25;
  if (keycode == KEY_LEFTSHIFT) return keycode - 37;                // 42
  if (keycode >= KEY_RIGHTSHIFT && keycode <= KEY_KPDOT)               // 54-83
    return keycode - 48;
  if (keycode >= KEY_F11 && keycode <= KEY_F12)               // 87-88
    return keycode - 51;
  if (keycode >= KEY_KPENTER && keycode <= KEY_DELETE)               // 96-111
    return keycode - 58;
  if (keycode == KEY_PAUSE)               // 119
    return keycode - 65;
  if (keycode >= KEY_LEFTMETA && keycode <= KEY_COMPOSE)               // 125-127
    return keycode - 70;

  return -1;               // not function key keycode
}